

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O0

uint16_t __thiscall AmsRouter::OpenPort(AmsRouter *this)

{
  bool bVar1;
  reference pvVar2;
  ushort local_22;
  uint16_t i;
  lock_guard<std::recursive_mutex> lock;
  AmsRouter *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffe0,&this->mutex);
  local_22 = 0;
  do {
    if (0x7f < local_22) {
      this_local._6_2_ = 0;
LAB_0019ff3b:
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)&stack0xffffffffffffffe0);
      return this_local._6_2_;
    }
    pvVar2 = std::array<AmsPort,_128UL>::operator[](&this->ports,(ulong)local_22);
    bVar1 = AmsPort::IsOpen(pvVar2);
    if (!bVar1) {
      pvVar2 = std::array<AmsPort,_128UL>::operator[](&this->ports,(ulong)local_22);
      this_local._6_2_ = AmsPort::Open(pvVar2,local_22 + 30000);
      goto LAB_0019ff3b;
    }
    local_22 = local_22 + 1;
  } while( true );
}

Assistant:

uint16_t AmsRouter::OpenPort()
{
    std::lock_guard<std::recursive_mutex> lock(mutex);

    for (uint16_t i = 0; i < NUM_PORTS_MAX; ++i) {
        if (!ports[i].IsOpen()) {
            return ports[i].Open(PORT_BASE + i);
        }
    }
    return 0;
}